

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

Var Js::JavascriptOperators::GetElementIWithCache<true>
              (Var instance,RecyclableObject *index,
              PropertyRecordUsageCache *propertyRecordUsageCache,ScriptContext *scriptContext,
              PropertyCacheOperationInfo *operationInfo)

{
  PropertyRecord *this;
  undefined8 propertyObject;
  bool bVar1;
  uint32 index_00;
  BOOL BVar2;
  undefined1 local_80 [8];
  PropertyValueInfo info;
  RecyclableObject *object;
  Var value;
  
  info.inlineCacheIndex = 0;
  info.isFunctionPIC = false;
  info.allowResizingPolymorphicInlineCache = false;
  info._62_2_ = 0;
  bVar1 = GetPropertyObjectForElementAccess
                    (instance,index,scriptContext,(RecyclableObject **)&info.inlineCacheIndex,
                     JSERR_Property_CannotGet_NullOrUndefined);
  propertyObject = info._56_8_;
  if (bVar1) {
    this = (propertyRecordUsageCache->propertyRecord).ptr;
    if (this->isNumeric == true) {
      index_00 = PropertyRecord::GetNumericValue(this);
      BVar2 = GetItem(instance,(RecyclableObject *)propertyObject,index_00,&object,scriptContext);
      if (BVar2 != 0) {
        return object;
      }
    }
    else {
      local_80 = (undefined1  [8])0x0;
      info.m_instance = (RecyclableObject *)0x50000ffff;
      info.m_propertyIndex = 0;
      info.m_attributes = '\0';
      info.flags = InlineCacheNoFlags;
      info.cacheInfoFlag = 0;
      info.inlineCache = (InlineCache *)0x0;
      info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
      info.functionBody = (FunctionBody *)0x0;
      info.prop = (RecyclableObject *)0x0;
      info.propertyRecordUsageCache._0_4_ = 0xffffffff;
      info.propertyRecordUsageCache._5_1_ = 1;
      bVar1 = PropertyRecordUsageCache::TryGetPropertyFromCache<false,false,true>
                        (propertyRecordUsageCache,instance,(RecyclableObject *)info._56_8_,&object,
                         scriptContext,(PropertyValueInfo *)local_80,index,operationInfo);
      if (bVar1) {
        bVar1 = false;
      }
      else {
        BVar2 = GetPropertyWPCache<false,int>
                          (instance,(RecyclableObject *)info._56_8_,this->pid,&object,scriptContext,
                           (PropertyValueInfo *)local_80);
        bVar1 = BVar2 == 0;
      }
      if (!bVar1) {
        return object;
      }
    }
  }
  return (((scriptContext->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase)
         .undefinedValue.ptr;
}

Assistant:

Var JavascriptOperators::GetElementIWithCache(
        _In_ Var instance,
        _In_ RecyclableObject* index,
        _In_ PropertyRecordUsageCache* propertyRecordUsageCache,
        _In_ ScriptContext* scriptContext,
        _Inout_opt_ PropertyCacheOperationInfo* operationInfo)
    {
        RecyclableObject* object = nullptr;
        if (!JavascriptOperators::GetPropertyObjectForGetElementI(instance, index, scriptContext, &object))
        {
            return scriptContext->GetLibrary()->GetUndefined();
        }

        PropertyRecord const * propertyRecord = propertyRecordUsageCache->GetPropertyRecord();
        Var value;

        if (propertyRecord->IsNumeric())
        {
            if (JavascriptOperators::GetItem(instance, object, propertyRecord->GetNumericValue(), &value, scriptContext))
            {
                return value;
            }
        }
        else
        {
            PropertyValueInfo info;
            if (propertyRecordUsageCache->TryGetPropertyFromCache<false /* OwnPropertyOnly */, false /* OutputExistence */, ReturnOperationInfo>(instance, object, &value, scriptContext, &info, index, operationInfo))
            {
                return value;
            }
            if (JavascriptOperators::GetPropertyWPCache<false /* OutputExistence */>(instance, object, propertyRecord->GetPropertyId(), &value, scriptContext, &info))
            {
                return value;
            }
        }
        return scriptContext->GetLibrary()->GetUndefined();
    }